

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManCoLargestSupp(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_34;
  int local_30;
  int nSuppMax;
  int iCoMax;
  int i;
  Vec_Int_t *vSuppOne;
  Gia_Obj_t *pObj;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  
  local_30 = -1;
  local_34 = -1;
  nSuppMax = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (nSuppMax < iVar1) {
      pGVar2 = Gia_ManCo(p,nSuppMax);
      bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    p_00 = Vec_WecEntry(vSupps,nSuppMax);
    iVar1 = Vec_IntSize(p_00);
    if (local_34 < iVar1) {
      local_34 = Vec_IntSize(p_00);
      local_30 = nSuppMax;
    }
    nSuppMax = nSuppMax + 1;
  }
  return local_30;
}

Assistant:

int Gia_ManCoLargestSupp( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vSuppOne;
    int i, iCoMax = -1, nSuppMax = -1;
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( nSuppMax < Vec_IntSize(vSuppOne) )
        {
            nSuppMax = Vec_IntSize(vSuppOne);
            iCoMax = i;
        }
    }
    return iCoMax;
}